

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error coda_XML_UseForeignDTD(XML_Parser parser,XML_Bool useDTD)

{
  XML_Error XVar1;
  
  if (parser == (XML_Parser)0x0) {
    XVar1 = XML_ERROR_INVALID_ARGUMENT;
  }
  else {
    if (((parser->m_parsingStatus).parsing | XML_FINISHED) != XML_SUSPENDED) {
      parser->m_useForeignDTD = useDTD;
      return XML_ERROR_NONE;
    }
    XVar1 = XML_ERROR_CANT_CHANGE_FEATURE_ONCE_PARSING;
  }
  return XVar1;
}

Assistant:

enum XML_Error XMLCALL
XML_UseForeignDTD(XML_Parser parser, XML_Bool useDTD) {
  if (parser == NULL)
    return XML_ERROR_INVALID_ARGUMENT;
#ifdef XML_DTD
  /* block after XML_Parse()/XML_ParseBuffer() has been called */
  if (parser->m_parsingStatus.parsing == XML_PARSING
      || parser->m_parsingStatus.parsing == XML_SUSPENDED)
    return XML_ERROR_CANT_CHANGE_FEATURE_ONCE_PARSING;
  parser->m_useForeignDTD = useDTD;
  return XML_ERROR_NONE;
#else
  UNUSED_P(useDTD);
  return XML_ERROR_FEATURE_REQUIRES_XML_DTD;
#endif
}